

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O1

void __thiscall QWindowContainer::~QWindowContainer(QWindowContainer *this)

{
  ~QWindowContainer(this + -0x10);
  operator_delete(this + -0x10,0x28);
  return;
}

Assistant:

QWindowContainer::~QWindowContainer()
{
    Q_D(QWindowContainer);

    // Call destroy() explicitly first. The dtor would do this too, but
    // QEvent::PlatformSurface delivery relies on virtuals. Getting
    // SurfaceAboutToBeDestroyed can be essential for OpenGL, Vulkan, etc.
    // QWindow subclasses in particular. Keep these working.
    if (d->window) {
        d->window->removeEventFilter(this);
        d->window->destroy();
    }

    delete d->window;
}